

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithmFORTRAN_wrap.cxx
# Opt level: O2

int find_sorted<int>(int *DATA,size_t SIZE,int value)

{
  int *piVar1;
  int iVar2;
  size_t sVar3;
  int local_14;
  
  local_14 = value;
  piVar1 = std::__lower_bound<int_const*,int,__gnu_cxx::__ops::_Iter_less_val>
                     (DATA,DATA + SIZE,&local_14);
  sVar3 = (long)piVar1 - (long)DATA >> 2;
  iVar2 = 0;
  if ((sVar3 != SIZE) && (iVar2 = 0, *(int *)((long)DATA + ((long)piVar1 - (long)DATA)) == local_14)
     ) {
    iVar2 = (int)sVar3 + 1;
  }
  return iVar2;
}

Assistant:

int find_sorted(const T *DATA, size_t SIZE, T value) {
  size_t result = std::lower_bound(DATA, DATA + SIZE, value) - DATA;
  if (result == SIZE || DATA[result] != value) return 0;
  return result + 1;
}